

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O2

aiReturn aiExportSceneEx(aiScene *pScene,char *pFormatId,char *pFileName,aiFileIO *pIO,
                        uint pPreprocessing)

{
  aiReturn aVar1;
  IOSystem *pIOHandler;
  Exporter exp;
  
  Assimp::Exporter::Exporter(&exp);
  if (pIO != (aiFileIO *)0x0) {
    pIOHandler = (IOSystem *)Assimp::Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (pIOHandler->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIOHandler->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIOHandler->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIOHandler->_vptr_IOSystem = (_func_int **)&PTR__IOSystem_0082d248;
    pIOHandler[1]._vptr_IOSystem = (_func_int **)pIO;
    Assimp::Exporter::SetIOHandler(&exp,pIOHandler);
  }
  aVar1 = Assimp::Exporter::Export
                    (&exp,pScene,pFormatId,pFileName,pPreprocessing,(ExportProperties *)0x0);
  Assimp::Exporter::~Exporter(&exp);
  return aVar1;
}

Assistant:

ASSIMP_API aiReturn aiExportSceneEx( const aiScene* pScene, const char* pFormatId, const char* pFileName, aiFileIO* pIO, unsigned int pPreprocessing )
{
    Exporter exp;

    if (pIO) {
        exp.SetIOHandler(new CIOSystemWrapper(pIO));
    }
    return exp.Export(pScene,pFormatId,pFileName,pPreprocessing);
}